

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::ActivateTheme(Context *this,String *theme_name,bool activate)

{
  int iVar1;
  size_type sVar2;
  pointer pEVar3;
  Element *this_00;
  ElementDocument *this_01;
  pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar4;
  ElementDocument *document;
  int i;
  bool local_1a;
  bool theme_changed;
  bool activate_local;
  String *theme_name_local;
  Context *this_local;
  
  if (activate) {
    pVar4 = itlib::
            flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(&this->active_themes,theme_name);
    local_1a = (bool)(pVar4.second & 1);
  }
  else {
    sVar2 = itlib::
            flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::erase<std::__cxx11::string>
                      ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&this->active_themes,theme_name);
    local_1a = sVar2 != 0;
  }
  if (local_1a != false) {
    document._4_4_ = 0;
    while( true ) {
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      iVar1 = Element::GetNumChildren(pEVar3,true);
      if (iVar1 <= document._4_4_) break;
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      this_00 = Element::GetChild(pEVar3,document._4_4_);
      this_01 = Element::GetOwnerDocument(this_00);
      if (this_01 != (ElementDocument *)0x0) {
        ElementDocument::DirtyMediaQueries(this_01);
      }
      document._4_4_ = document._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void Context::ActivateTheme(const String& theme_name, bool activate)
{
	bool theme_changed = false;

	if (activate)
		theme_changed = active_themes.insert(theme_name).second;
	else
		theme_changed = (active_themes.erase(theme_name) > 0);

	if (theme_changed)
	{
		for (int i = 0; i < root->GetNumChildren(true); ++i)
		{
			if (ElementDocument* document = root->GetChild(i)->GetOwnerDocument())
				document->DirtyMediaQueries();
		}
	}
}